

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int update_path_and_do(c2m_ctx_t c2m_ctx,int go_inside_p,
                      _func_void_c2m_ctx_t_decl_t_type_ptr_ptr_node_t_int_int *action,size_t mark,
                      node_t_conflict value,int const_only_p,mir_llong *max_index,pos_t pos,
                      char *detail)

{
  int iVar1;
  type **local_e8;
  bool local_c1;
  type *local_c0;
  init_object_t local_a0;
  undefined1 local_88 [16];
  anon_union_8_2_e4b0c9a5_for_u local_78;
  void *local_70;
  expr_conflict *value_expr;
  type *el_type;
  mir_llong index;
  init_object_t init_object;
  int const_only_p_local;
  node_t_conflict value_local;
  size_t mark_local;
  _func_void_c2m_ctx_t_decl_t_type_ptr_ptr_node_t_int_int *action_local;
  int go_inside_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  local_70 = value->attr;
  if (local_70 == (void *)0x0) {
    local_c0 = (type *)0x0;
  }
  else {
    local_c0 = *(type **)((long)local_70 + 0x18);
  }
  local_c1 = true;
  if ((go_inside_p != 0) && (local_c1 = true, value->code != N_LIST)) {
    local_c1 = value->code == N_COMPOUND_LITERAL;
  }
  init_object.u.curr_index._4_4_ = const_only_p;
  iVar1 = update_init_object_path(c2m_ctx,mark,local_c0,(uint)local_c1);
  if (iVar1 == 0) {
    error(c2m_ctx,0x1d5c8c,pos.fname,pos._8_8_,detail);
    c2m_ctx_local._4_4_ = 0;
  }
  else if (go_inside_p == 0) {
    c2m_ctx_local._4_4_ = 1;
  }
  else {
    VARR_init_object_tlast((init_object_t *)local_88,c2m_ctx->init_object_path);
    index = local_88._0_8_;
    init_object.container_type = (type *)local_88._8_8_;
    init_object._8_8_ = local_78;
    if (*(type_mode *)(local_88._0_8_ + 0x18) == TM_ARR) {
      value_expr = (expr_conflict *)
                   ((anon_union_8_5_3fbb1736_for_u *)(local_88._0_8_ + 0x30))->ptr_type->arr_type;
      iVar1 = init_compatible_string_p(value,(type *)value_expr);
      if (iVar1 == 0) {
        local_e8 = (type **)(*(long *)(index + 0x30) + 8);
      }
      else {
        local_e8 = (type **)&index;
      }
      (*action)(c2m_ctx,(decl_t)0x0,local_e8,value,init_object.u.curr_index._4_4_,0);
    }
    else if ((*(type_mode *)(local_88._0_8_ + 0x18) == TM_STRUCT) ||
            (*(type_mode *)(local_88._0_8_ + 0x18) == TM_UNION)) {
      (*action)(c2m_ctx,(decl_t)(local_78.curr_member)->attr,
                (type **)((long)(local_78.curr_member)->attr + 0x40),value,
                init_object.u.curr_index._4_4_,0);
    }
    if (((max_index != (mir_llong *)0x0) &&
        (VARR_init_object_tget(&local_a0,c2m_ctx->init_object_path,mark),
        (local_a0.container_type)->mode == TM_ARR)) && (*max_index < local_a0.u.curr_index)) {
      *max_index = (mir_llong)local_a0.u;
    }
    c2m_ctx_local._4_4_ = 1;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int update_path_and_do (c2m_ctx_t c2m_ctx, int go_inside_p,
                               void (*action) (c2m_ctx_t c2m_ctx, decl_t member_decl,
                                               struct type **type_ptr, node_t initializer,
                                               int const_only_p, int top_p),
                               size_t mark, node_t value, int const_only_p, mir_llong *max_index,
                               pos_t pos, const char *detail) {
  init_object_t init_object;
  mir_llong index;
  struct type *el_type;
  struct expr *value_expr = value->attr;

  if (!update_init_object_path (c2m_ctx, mark, value_expr == NULL ? NULL : value_expr->type,
                                !go_inside_p || value->code == N_LIST
                                  || value->code == N_COMPOUND_LITERAL)) {
    error (c2m_ctx, pos, "excess elements in %s initializer", detail);
    return FALSE;
  }
  if (!go_inside_p) return TRUE;
  init_object = VARR_LAST (init_object_t, init_object_path);
  if (init_object.container_type->mode == TM_ARR) {
    el_type = init_object.container_type->u.arr_type->el_type;
    action (c2m_ctx, NULL,
            (init_compatible_string_p (value, el_type)
               ? &init_object.container_type
               : &init_object.container_type->u.arr_type->el_type),
            value, const_only_p, FALSE);
  } else if (init_object.container_type->mode == TM_STRUCT
             || init_object.container_type->mode == TM_UNION) {
    action (c2m_ctx, (decl_t) init_object.u.curr_member->attr,
            &((decl_t) init_object.u.curr_member->attr)->decl_spec.type, value, const_only_p,
            FALSE);
  }
  if (max_index != NULL) {
    init_object = VARR_GET (init_object_t, init_object_path, mark);
    if (init_object.container_type->mode == TM_ARR
        && *max_index < (index = init_object.u.curr_index))
      *max_index = index;
  }
  return TRUE;
}